

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O1

void __thiscall Game::resetGame(Game *this)

{
  Game *in_RSI;
  vector<int,_std::allocator<int>_> local_28;
  
  (this->gameResult).bulls = 0;
  (this->gameResult).cows = 0;
  this->guessCount = 0;
  getReferenceNumbers(&local_28,in_RSI);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->referenceNumbers,&local_28);
  if (local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Game::resetGame()
{
	gameResult = GameResult(0, 0);
	guessCount = 0;
	referenceNumbers = getReferenceNumbers();
}